

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void copy_action(void)

{
  char *pcVar1;
  bucket **ppbVar2;
  char cVar3;
  ushort uVar4;
  int lineno;
  bool bVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  FILE *__stream;
  bucket **ppbVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  char *line;
  char *line_00;
  union_tag *puVar13;
  ushort **ppuVar14;
  ulong uVar15;
  bucket *pbVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  ulong uStack_b0;
  char *local_90;
  int local_50;
  
  __stream = action_file;
  lineno = input_file->lineno;
  line = dup_line();
  lVar19 = (long)cptr - (long)::line;
  if (last_was_action == '\x01') {
    insert_empty_rule();
  }
  last_was_action = 1;
  trialaction = *cptr == '[';
  fprintf((FILE *)__stream,"case %d:\n",(ulong)(nrules - 2));
  if (trialaction == '\0') {
    fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
  }
  if (lflag == '\0') {
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  if (*cptr == '=') {
    cptr = cptr + 1;
  }
  lVar24 = (long)nitems;
  lVar23 = 0;
  iVar20 = 0;
  while (pitem[lVar24 + lVar23 + -1] != (bucket *)0x0) {
    iVar20 = iVar20 + (uint)(pitem[lVar24 + lVar23 + -1]->class != '\x04');
    lVar23 = lVar23 + -1;
  }
  if (iVar20 != 0) {
    local_90 = allocate(iVar20 * 4 + 4);
    if (local_90 != (char *)0x0) goto LAB_00115414;
    no_space();
  }
  local_90 = (char *)0x0;
LAB_00115414:
  ppbVar9 = pitem;
  lVar24 = lVar24 + lVar23;
  iVar6 = (int)lVar23;
  local_50 = -iVar6;
  uVar15 = 0;
  do {
    lVar23 = (long)nitems;
    iVar17 = (int)lVar24 - nitems;
    do {
      if (lVar23 <= lVar24) goto LAB_00115460;
      ppbVar2 = ppbVar9 + lVar24;
      lVar24 = lVar24 + 1;
      iVar17 = iVar17 + 1;
    } while ((*ppbVar2)->class == '\x04');
    *(int *)(local_90 + uVar15 * 4 + 4) = iVar17;
    uVar15 = (ulong)((int)uVar15 + 1);
  } while( true );
LAB_00115460:
  iVar17 = 0;
  bVar10 = false;
LAB_0011546b:
  do {
    while (bVar7 = bVar10, pcVar22 = cptr, cVar3 = *cptr, bVar10 = bVar7, cVar3 == '@') {
      cVar3 = cptr[1];
      if ((cVar3 == '@') || (cVar3 == '$')) {
        fprintf((FILE *)__stream,"%spos",symbol_prefix);
        cptr = cptr + 2;
      }
      else {
        ppuVar14 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar14 + (long)cVar3 * 2 + 1) & 8) == 0) {
          if (cVar3 != '-') {
            uStack_b0 = 0x40;
            goto LAB_00115569;
          }
          cptr = pcVar22 + 2;
          iVar11 = get_number();
          uVar18 = iVar6 - iVar11;
        }
        else {
          cptr = pcVar22 + 1;
          iVar11 = get_number();
          if (local_50 < iVar11) {
            at_warning(input_file->lineno,iVar11);
            uVar18 = iVar11 - iVar20;
            pcVar22 = "%spsp[%d]";
LAB_0011599c:
            uVar15 = (ulong)uVar18;
            goto LAB_00115b65;
          }
          uVar18 = *(uint *)(local_90 + (long)iVar11 * 4);
        }
        uVar15 = (ulong)uVar18;
        pcVar22 = "%spsp[%d]";
LAB_00115b65:
        fprintf((FILE *)__stream,pcVar22,symbol_prefix,uVar15);
      }
    }
    if (cVar3 == '$') {
      cVar3 = cptr[1];
      if (cVar3 == '$') {
        if (havetags == 0) {
          fprintf((FILE *)__stream,"%sval",symbol_prefix);
        }
        else {
          if ((plhs[nrules]->tag == (union_tag *)0x0) ||
             (pcVar22 = plhs[nrules]->tag->name, pcVar22 == (char *)0x0)) {
            untyped_lhs();
            pcVar22 = (char *)0x0;
          }
          fprintf((FILE *)__stream,"%sval.%s",symbol_prefix,pcVar22);
        }
        cptr = cptr + 2;
        bVar10 = true;
        goto LAB_0011546b;
      }
      if (cVar3 != '<') {
        pcVar1 = cptr + 1;
        ppuVar14 = __ctype_b_loc();
        if (((*ppuVar14)[cVar3] >> 0xb & 1) == 0) {
          if (cVar3 != '-') {
            if ((cVar3 != '_') && (((*ppuVar14)[cVar3] & 0x400) == 0)) {
              uStack_b0 = 0x24;
              goto LAB_00115569;
            }
            cptr = pcVar1;
            puVar13 = get_tag(0);
            pbVar16 = plhs[nrules];
            uVar18 = pbVar16->args;
            lVar24 = (ulong)uVar18 << 0x20;
            uVar15 = (ulong)uVar18;
            iVar11 = iVar6 + uVar18;
            do {
              iVar12 = iVar11;
              lVar24 = lVar24 + -0x100000000;
              if ((int)uVar15 < 1) {
                error(input_file->lineno,::line,cptr,"unknown argument %s");
                pbVar16 = plhs[nrules];
                uVar18 = pbVar16->args;
                break;
              }
              lVar8 = uVar15 - 1;
              uVar15 = uVar15 - 1;
              iVar11 = iVar12 + -1;
            } while (puVar13->name != pbVar16->argnames[lVar8]);
            lVar24 = *(long *)((long)pbVar16->argtags + (lVar24 >> 0x1d));
            fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)(iVar12 - uVar18));
            if (lVar24 == 0) {
              if (havetags != 0) {
                error(input_file->lineno,(char *)0x0,(char *)0x0,"untyped argument $%s");
              }
            }
            else {
              fprintf((FILE *)__stream,".%s",lVar24);
            }
            goto LAB_0011546b;
          }
          cptr = pcVar22 + 2;
          iVar11 = get_number();
          if (havetags != 0) {
            unknown_rhs(-iVar11);
          }
          uVar18 = iVar6 - iVar11;
        }
        else {
          cptr = pcVar1;
          iVar11 = get_number();
          lVar24 = (long)iVar11;
          if (havetags != 0) {
            if ((iVar11 < 1) || (iVar20 < iVar11)) {
              unknown_rhs(iVar11);
            }
            uVar15 = (ulong)*(int *)(local_90 + lVar24 * 4);
            pbVar16 = ppbVar9[lVar23 + (uVar15 - 1)];
            puVar13 = pbVar16->tag;
            if ((puVar13 == (union_tag *)0x0) || (pcVar22 = puVar13->name, pcVar22 == (char *)0x0))
            {
              untyped_rhs(iVar11,pbVar16->name);
              uVar15 = (ulong)*(uint *)(local_90 + lVar24 * 4);
              pcVar22 = (char *)0x0;
            }
            fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,uVar15,pcVar22);
            goto LAB_0011546b;
          }
          if (local_50 < iVar11) {
            dollar_warning(input_file->lineno,iVar11);
            uVar18 = iVar11 - iVar20;
            pcVar22 = "%svsp[%d]";
            goto LAB_0011599c;
          }
          uVar18 = *(uint *)(local_90 + lVar24 * 4);
        }
        uVar15 = (ulong)uVar18;
        pcVar22 = "%svsp[%d]";
        goto LAB_00115b65;
      }
      iVar11 = input_file->lineno;
      line_00 = dup_line();
      lVar24 = (long)cptr - (long)::line;
      cptr = cptr + 1;
      puVar13 = get_tag(1);
      pcVar1 = cptr;
      pcVar22 = puVar13->name;
      cVar3 = *cptr;
      uVar18 = (uint)cVar3;
      uStack_b0 = (ulong)uVar18;
      if (uVar18 == 0x24) {
        fprintf((FILE *)__stream,"%sval.%s",symbol_prefix);
        cptr = cptr + 1;
      }
      else {
        ppuVar14 = __ctype_b_loc();
        uVar4 = (*ppuVar14)[(int)uVar18];
        if ((uVar4 >> 0xb & 1) == 0) {
          if ((cVar3 == '-') && ((*(byte *)((long)*ppuVar14 + (long)pcVar1[1] * 2 + 1) & 8) != 0)) {
            cptr = pcVar1 + 1;
            iVar11 = get_number();
            fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)(uint)(iVar6 - iVar11),
                    pcVar22);
            free(line_00);
            goto LAB_0011546b;
          }
          if ((cVar3 != '_') && ((uVar4 & 0x400) == 0)) {
            dollar_error(iVar11,line_00,line_00 + lVar24);
            goto LAB_00115569;
          }
          puVar13 = get_tag(0);
          uVar18 = plhs[nrules]->args;
          uVar15 = (ulong)uVar18;
          iVar12 = iVar6 + uVar18;
          do {
            iVar21 = iVar12;
            if ((int)uVar15 < 1) {
              error(iVar11,line_00,line_00 + lVar24,"unknown argument %s");
              uVar18 = plhs[nrules]->args;
              break;
            }
            lVar8 = uVar15 - 1;
            uVar15 = uVar15 - 1;
            iVar12 = iVar21 + -1;
          } while (puVar13->name != plhs[nrules]->argnames[lVar8]);
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)(iVar21 - uVar18),pcVar22);
        }
        else {
          iVar12 = get_number();
          uVar18 = iVar12 - iVar20;
          if (uVar18 == 0 || iVar12 < iVar20) {
            uVar18 = *(uint *)(local_90 + (long)iVar12 * 4);
          }
          else {
            dollar_warning(iVar11,iVar12);
          }
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)uVar18,pcVar22);
        }
      }
      free(line_00);
      goto LAB_0011546b;
    }
    uStack_b0 = (ulong)(uint)(int)cVar3;
    ppuVar14 = __ctype_b_loc();
LAB_00115569:
    iVar11 = (int)uStack_b0;
    if (((((*ppuVar14)[iVar11] >> 10 & 1) != 0) || (iVar11 == 0x5f)) || (iVar11 == 0x24)) {
      do {
        do {
          putc((int)uStack_b0,(FILE *)__stream);
          pcVar22 = cptr + 1;
          cVar3 = cptr[1];
          uStack_b0 = (ulong)cVar3;
          cptr = pcVar22;
        } while (((*ppuVar14)[uStack_b0] & 8) != 0);
      } while ((cVar3 == '$') || (cVar3 == '_'));
      goto LAB_0011546b;
    }
    cptr = cptr + 1;
    if ((iVar11 == 0x5b && iVar17 == 0) && trialaction != '\0') {
      putc(0x7b,(FILE *)__stream);
      iVar17 = 1;
      goto LAB_0011546b;
    }
    if ((iVar17 != 1 || iVar11 != 0x5d) || trialaction == '\0') {
      putc(iVar11,(FILE *)__stream);
      if (iVar11 == 0x7d) {
        iVar11 = iVar17 + -1;
        bVar5 = iVar17 < 2;
        iVar17 = iVar11;
        if (bVar5) {
          iVar11 = nextc();
          if (iVar11 == 0x5b && !bVar7) {
            trialaction = '\x01';
          }
          else {
            fputc(10,(FILE *)__stream);
            if ((iVar11 != 0x7b) || (bVar7)) goto joined_r0x00115ef5;
            if (lflag == '\0') {
              fwrite("#\n",2,1,(FILE *)__stream);
            }
            fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
            bVar10 = false;
            if (lflag != '\0') goto LAB_0011546b;
            fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
          }
          bVar10 = false;
        }
        goto LAB_0011546b;
      }
      if ((iVar11 != 0x22) && (iVar11 != 0x27)) {
        if (iVar11 == 0x2f) {
          copy_comment(__stream,(FILE *)0x0);
          goto LAB_0011546b;
        }
        if (iVar11 == 0x3b) {
LAB_00115a2b:
          if (iVar17 < 1) {
            fputc(10,(FILE *)__stream);
            goto joined_r0x00115ef5;
          }
          goto LAB_0011546b;
        }
        if (iVar11 != 0x5b) {
          if (iVar11 == 0x5d) {
            iVar17 = iVar17 + -1;
            goto LAB_0011546b;
          }
          if (iVar11 != 0x7b) {
            if ((iVar11 == 10) && (get_line(), ::line == (char *)0x0)) {
              unterminated_action(lineno,line,line + lVar19);
              goto LAB_00115a2b;
            }
            goto LAB_0011546b;
          }
        }
        iVar17 = iVar17 + 1;
        goto LAB_0011546b;
      }
      copy_string(iVar11,__stream,(FILE *)0x0);
      goto LAB_0011546b;
    }
    putc(0x7d,(FILE *)__stream);
    iVar11 = nextc();
    iVar17 = 0;
    bVar10 = false;
  } while (iVar11 == 0x5b && !bVar7);
  fputc(10,(FILE *)__stream);
  if ((iVar11 != 0x7b) || (bVar7)) {
joined_r0x00115ef5:
    if (lflag == '\0') {
      fwrite("#\n",2,1,(FILE *)__stream);
    }
    fwrite("break;\n",7,1,(FILE *)__stream);
    free(line);
    if (iVar20 == 0) {
      return;
    }
    free(local_90);
    return;
  }
  if (lflag == '\0') {
    fwrite("#\n",2,1,(FILE *)__stream);
  }
  fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
  if (lflag == '\0') {
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  trialaction = '\0';
  goto LAB_00115460;
}

Assistant:

void copy_action()
{
    register int c;
    register int i, j, n;
    int depth;
    int haveyyval = 0;
    char *tag;
    register FILE *f = action_file;
    int a_lineno = input_file->lineno;
    char *a_line = dup_line();
    char *a_cptr = a_line + (cptr - line);
    Yshort *offsets=0, maxoffset;
    bucket **rhs;

    if (last_was_action)
	insert_empty_rule();
    last_was_action = 1;
    trialaction = (*cptr == '[');

    fprintf(f, "case %d:\n", nrules - 2);
    if (!trialaction)
	fprintf(f, "  if (!%strial)\n", symbol_prefix);
    if (!lflag)
	fprintf(f, line_format, input_file->lineno, input_file->name);
    if (*cptr == '=') ++cptr;

    /* FIXME -- the argument offset table is computed independently in
     * FIXME -- several places (compile_arg, copy_action, and can_elide_arg)
     * FIXME -- those multiple implementations should be factored into
     * FIXME -- a single function. */
    maxoffset = n = 0;
    for (i = nitems - 1; pitem[i]; --i) {
	n++;
	if (pitem[i]->class != ARGUMENT)
	    maxoffset++; }
    if (maxoffset > 0) {
	offsets = NEW2(maxoffset+1, Yshort);
	if (offsets == 0) no_space(); }
    for (j=0, i++; i<nitems; i++)
	if (pitem[i]->class != ARGUMENT)
	    offsets[++j] = i - nitems + 1;
    rhs = pitem + nitems - 1;

    depth = 0;
loop:
    c = *cptr;
    if (c == '$') {
	if (cptr[1] == '<') {
	    int d_lineno = input_file->lineno;
	    char *d_line = dup_line();
	    char *d_cptr = d_line + (cptr - line);

	    ++cptr;
	    tag = get_tag(1)->name;
	    c = *cptr;
	    if (c == '$') {
		fprintf(f, "%sval.%s", symbol_prefix, tag);
		++cptr;
		FREE(d_line);
		goto loop; }
	    else if (isdigit(c)) {
		i = get_number();
		if (i > maxoffset) {
		    dollar_warning(d_lineno, i);
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, i - maxoffset, tag); }
		else
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag);
		FREE(d_line);
		goto loop; }
	    else if (c == '-' && isdigit(cptr[1])) {
		++cptr;
		i = -get_number() - n;
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i, tag);
		FREE(d_line);
		goto loop; }
	    else if (isalpha(c) || c == '_') {
		char *arg = get_tag(0)->name;
		for (i=plhs[nrules]->args-1; i>=0; i--)
		    if (arg == plhs[nrules]->argnames[i]) break;
		if (i<0)
		    error(d_lineno,d_line,d_cptr,"unknown argument %s",arg);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i-plhs[nrules]->args+1-n, tag);
		FREE(d_line);
		goto loop; }
	    else
		dollar_error(d_lineno, d_line, d_cptr); }
	else if (cptr[1] == '$') {
	    if (havetags) {
		tag = plhs[nrules]->tag ? plhs[nrules]->tag->name : 0;
		if (tag == 0) untyped_lhs();
		fprintf(f, "%sval.%s", symbol_prefix, tag); }
	    else
		fprintf(f, "%sval", symbol_prefix);
	    cptr += 2;
	    haveyyval = 1;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (havetags) {
		if (i <= 0 || i > maxoffset)
		    unknown_rhs(i);
		tag = rhs[offsets[i]]->tag ? rhs[offsets[i]]->tag->name : 0;
		if (tag == 0)
		    untyped_rhs(i, rhs[offsets[i]]->name);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag); }
	    else {
		if (i > n) {
		    dollar_warning(input_file->lineno, i);
		    fprintf(f, "%svsp[%d]", symbol_prefix, i - maxoffset); }
		else
		    fprintf(f, "%svsp[%d]", symbol_prefix, offsets[i]); }
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    if (havetags)
		unknown_rhs(-i);
	    fprintf(f, "%svsp[%d]", symbol_prefix, -i - n);
	    goto loop; }
	else if (isalpha(cptr[1]) || cptr[1] == '_') {
	    char *arg;
	    ++cptr;
	    arg = get_tag(0)->name;
	    for (i=plhs[nrules]->args-1; i>=0; i--)
		if (arg == plhs[nrules]->argnames[i]) break;
	    if (i<0)
		error(input_file->lineno, line, cptr, "unknown argument %s", arg);
	    tag = plhs[nrules]->argtags[i];
	    fprintf(f, "%svsp[%d]", symbol_prefix, i - plhs[nrules]->args + 1 - n);
	    if (tag) fprintf(f, ".%s", tag);
	    else if (havetags)
		error(input_file->lineno, 0, 0, "untyped argument $%s", arg);
	    goto loop; }
    } else if (c == '@') {
	if (cptr[1] == '@' || cptr[1] == '$') {
	    fprintf(f, "%spos", symbol_prefix);
	    cptr += 2;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (i > n) {
		at_warning(input_file->lineno, i);
		fprintf(f, "%spsp[%d]", symbol_prefix, i - maxoffset); }
	    else
		fprintf(f, "%spsp[%d]", symbol_prefix, offsets[i]);
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    fprintf(f, "%spsp[%d]", symbol_prefix, -i - n);
	    goto loop; } }
    if (isalpha(c) || c == '_' || c == '$') {
	do {
	    putc(c, f);
	    c = *++cptr;
	} while (isalnum(c) || c == '_' || c == '$');
	goto loop; }
    ++cptr;
    if (trialaction && c == '[' && depth == 0) {
	++depth;
	putc('{', f);
	goto loop; }
    if (trialaction && c == ']' && depth == 1) {
	--depth;
	putc('}', f);
	c = nextc();
	if (c == '[' && !haveyyval) {
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    trialaction = 0;
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; } }
    putc(c, f);
    switch (c) {
    case '\n':
	get_line();
	if (line) goto loop;
	unterminated_action(a_lineno, a_line, a_cptr);
    case ';':
	if (depth > 0) goto loop;
	fprintf(f, "\n");
	if (!lflag) fprintf(f, "#\n");
	fprintf(f, "break;\n");
	FREE(a_line);
	if (maxoffset > 0) FREE(offsets);
	return;
    case '[':
	++depth;
	goto loop;
    case ']':
	--depth;
	goto loop;
    case '{':
	++depth;
	goto loop;
    case '}':
	if (--depth > 0) goto loop;
	c = nextc();
	if (c == '[' && !haveyyval) {
	    trialaction = 1;
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; }
    case '\'':
    case '"':
	copy_string(c, f, 0);
	goto loop;
    case '/':
	copy_comment(f, 0);
	goto loop;
    default:
	goto loop; }
}